

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

bool __thiscall spv::Builder::containsType(Builder *this,Id typeId,Op typeOp,uint width)

{
  Op OVar1;
  Instruction *this_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Id IVar5;
  int iVar6;
  
  do {
    this_00 = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start[typeId];
    OVar1 = this_00->opCode;
    switch(OVar1) {
    case OpTypeInt:
    case OpTypeFloat:
      if (OVar1 != typeOp) {
        return false;
      }
      if ((*(this_00->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p & 1) != 0) {
        __assert_fail("!idOperand[op]",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                      ,0xa5,"unsigned int spv::Instruction::getImmediateOperand(int) const");
      }
      return *(this_00->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start == width;
    case OpTypeVector:
    case OpTypeMatrix:
    case OpTypeArray:
    case OpTypeRuntimeArray:
      typeId = getContainedTypeId(this,typeId,0);
      break;
    default:
      return OVar1 == typeOp;
    case OpTypeStruct:
      iVar4 = Instruction::getNumOperands(this_00);
      if (iVar4 < 1) {
        return 0 < iVar4;
      }
      IVar5 = Instruction::getIdOperand(this_00,0);
      bVar2 = containsType(this,IVar5,typeOp,width);
      if (bVar2) {
        return 0 < iVar4;
      }
      iVar4 = 1;
      do {
        iVar6 = Instruction::getNumOperands(this_00);
        bVar2 = iVar4 < iVar6;
        if (iVar6 <= iVar4) {
          return bVar2;
        }
        IVar5 = Instruction::getIdOperand(this_00,iVar4);
        bVar3 = containsType(this,IVar5,typeOp,width);
        iVar4 = iVar4 + 1;
      } while (!bVar3);
      return bVar2;
    case OpTypePointer:
      return false;
    }
  } while( true );
}

Assistant:

bool Builder::containsType(Id typeId, spv::Op typeOp, unsigned int width) const
{
    const Instruction& instr = *module.getInstruction(typeId);

    Op typeClass = instr.getOpCode();
    switch (typeClass)
    {
    case OpTypeInt:
    case OpTypeFloat:
        return typeClass == typeOp && instr.getImmediateOperand(0) == width;
    case OpTypeStruct:
        for (int m = 0; m < instr.getNumOperands(); ++m) {
            if (containsType(instr.getIdOperand(m), typeOp, width))
                return true;
        }
        return false;
    case OpTypePointer:
        return false;
    case OpTypeVector:
    case OpTypeMatrix:
    case OpTypeArray:
    case OpTypeRuntimeArray:
        return containsType(getContainedTypeId(typeId), typeOp, width);
    default:
        return typeClass == typeOp;
    }
}